

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

uchar mbedtls_ssl_sig_from_pk(mbedtls_pk_context_conflict *pk)

{
  int iVar1;
  mbedtls_pk_context_conflict *pk_local;
  
  iVar1 = mbedtls_pk_can_do(pk,MBEDTLS_PK_ECDSA);
  if (iVar1 == 0) {
    pk_local._7_1_ = '\0';
  }
  else {
    pk_local._7_1_ = '\x03';
  }
  return pk_local._7_1_;
}

Assistant:

unsigned char mbedtls_ssl_sig_from_pk(mbedtls_pk_context *pk)
{
#if defined(MBEDTLS_RSA_C)
    if (mbedtls_pk_can_do(pk, MBEDTLS_PK_RSA)) {
        return MBEDTLS_SSL_SIG_RSA;
    }
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_ECDSA_CERT_REQ_ANY_ALLOWED_ENABLED)
    if (mbedtls_pk_can_do(pk, MBEDTLS_PK_ECDSA)) {
        return MBEDTLS_SSL_SIG_ECDSA;
    }
#endif
    return MBEDTLS_SSL_SIG_ANON;
}